

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int io_file_write(lua_State *L,IOFileUD *iof,int start)

{
  int iVar1;
  char *__ptr;
  size_t sVar2;
  bool local_41;
  char *p;
  MSize len;
  int status;
  cTValue *tv;
  FILE *fp;
  IOFileUD *pIStack_18;
  int start_local;
  IOFileUD *iof_local;
  lua_State *L_local;
  
  tv = (cTValue *)iof->fp;
  p._4_4_ = 1;
  _len = L->base + start;
  fp._4_4_ = start;
  pIStack_18 = iof;
  iof_local = (IOFileUD *)L;
  while( true ) {
    if (*(cTValue **)&iof_local[2].type <= _len) {
      iVar1 = luaL_fileresult((lua_State *)iof_local,p._4_4_,(char *)0x0);
      return iVar1;
    }
    __ptr = lj_strfmt_wstrnum((lua_State *)iof_local,_len,(MSize *)&p);
    if (__ptr == (char *)0x0) break;
    local_41 = false;
    if (p._4_4_ != 0) {
      sVar2 = fwrite(__ptr,1,(ulong)(uint)p,(FILE *)&tv->gcr);
      local_41 = sVar2 == (uint)p;
    }
    p._4_4_ = (uint)local_41;
    _len = _len + 1;
  }
  lj_err_argt((lua_State *)iof_local,(int)((long)_len - (long)iof_local[2].fp >> 3) + 1,4);
}

Assistant:

static int io_file_write(lua_State *L, IOFileUD *iof, int start)
{
  FILE *fp = iof->fp;
  cTValue *tv;
  int status = 1;
  for (tv = L->base+start; tv < L->top; tv++) {
    MSize len;
    const char *p = lj_strfmt_wstrnum(L, tv, &len);
    if (!p)
      lj_err_argt(L, (int)(tv - L->base) + 1, LUA_TSTRING);
    status = status && (fwrite(p, 1, len, fp) == len);
  }
  if (LJ_52 && status) {
    L->top = L->base+1;
    if (start == 0)
      setudataV(L, L->base, IOSTDF_UD(L, GCROOT_IO_OUTPUT));
    return 1;
  }
  return luaL_fileresult(L, status, NULL);
}